

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

function_record * pybind11::class_<asd::encode>::get_function_record(handle h)

{
  PyTypeObject *in_RAX;
  long *plVar1;
  function_record *pfVar2;
  PyTypeObject *pPVar3;
  handle local_18;
  
  if ((h.m_ptr != (PyObject *)0x0) &&
     ((h.m_ptr)->ob_type == (PyTypeObject *)&PyInstanceMethod_Type ||
      (h.m_ptr)->ob_type == (PyTypeObject *)&PyMethod_Type)) {
    h.m_ptr = (PyObject *)h.m_ptr[1].ob_refcnt;
  }
  if (h.m_ptr == (PyObject *)0x0) {
    pfVar2 = (function_record *)0x0;
    local_18.m_ptr = (PyObject *)in_RAX;
  }
  else {
    if ((*(byte *)(h.m_ptr[1].ob_refcnt + 0x10) & 0x20) == 0) {
      pPVar3 = h.m_ptr[1].ob_type;
    }
    else {
      pPVar3 = (PyTypeObject *)0x0;
    }
    local_18.m_ptr = (PyObject *)pPVar3;
    plVar1 = (long *)__tls_get_addr(&PTR_0019ddc0);
    *plVar1 = *plVar1 + 1;
    if (pPVar3 != (PyTypeObject *)0x0) {
      (pPVar3->ob_base).ob_base.ob_refcnt = (pPVar3->ob_base).ob_base.ob_refcnt + 1;
    }
    pfVar2 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&local_18);
  }
  if (h.m_ptr != (PyObject *)0x0) {
    object::~object((object *)&local_18);
  }
  return pfVar2;
}

Assistant:

static detail::function_record *get_function_record(handle h) {
        h = detail::get_function(h);
        return h ? (detail::function_record *) reinterpret_borrow<capsule>(
                   PyCFunction_GET_SELF(h.ptr()))
                 : nullptr;
    }